

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleoption.h
# Opt level: O2

void __thiscall QStyleOptionDockWidget::~QStyleOptionDockWidget(QStyleOptionDockWidget *this)

{
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->title).d);
  QStyleOption::~QStyleOption(&this->super_QStyleOption);
  return;
}

Assistant:

class Q_WIDGETS_EXPORT QStyleOptionDockWidget : public QStyleOption
{
public:
    enum StyleOptionType { Type = SO_DockWidget };
    enum StyleOptionVersion { Version = 1 };

    QString title;
    bool closable;
    bool movable;
    bool floatable;
    bool verticalTitleBar;

    QStyleOptionDockWidget();
    QStyleOptionDockWidget(const QStyleOptionDockWidget &other) : QStyleOption(Version, Type) { *this = other; }
    QStyleOptionDockWidget &operator=(const QStyleOptionDockWidget &) = default;

protected:
    QStyleOptionDockWidget(int version);
}